

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_buffer.cc
# Opt level: O0

void __thiscall bssl::SSLBuffer::Clear(SSLBuffer *this)

{
  SSLBuffer *this_local;
  
  if (this->buf_ != this->inline_buf_) {
    free(this->buf_);
  }
  this->buf_ = (uint8_t *)0x0;
  this->offset_ = 0;
  this->size_ = 0;
  this->cap_ = 0;
  return;
}

Assistant:

void SSLBuffer::Clear() {
  if (buf_ != inline_buf_) {
    free(buf_);  // Allocated with malloc().
  }
  buf_ = nullptr;
  offset_ = 0;
  size_ = 0;
  cap_ = 0;
}